

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNameNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  aiNode *this_00;
  DeadlyImportError *pDVar1;
  char *pcVar2;
  size_type sVar3;
  mapped_type_conflict3 *pmVar4;
  undefined1 local_4b0 [8];
  aiString aiName;
  string name;
  string local_80;
  Value *local_60;
  Value *val;
  allocator<char> local_41;
  string local_40;
  aiScene *local_20;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  local_20 = param_2;
  param_2_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  if (this->m_currentNode == (aiNode *)0x0) {
    val._3_1_ = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No current node for name.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_40);
    val._3_1_ = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_60 = ODDLParser::DDLNode::getValue(node);
  if (local_60 != (Value *)0x0) {
    if (local_60->m_type != ddl_string) {
      name.field_2._M_local_buf[0xe] = '\x01';
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"OpenGEX: invalid data type for value in node name.",
                 (allocator<char> *)(name.field_2._M_local_buf + 0xf));
      DeadlyImportError::DeadlyImportError(pDVar1,&local_80);
      name.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pcVar2 = ODDLParser::Value::getString(local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(aiName.data + 0x3fc),pcVar2,(allocator<char> *)(aiName.data + 0x3fb));
    std::allocator<char>::~allocator((allocator<char> *)(aiName.data + 0x3fb));
    if (((this->m_tokenType == 5) || (this->m_tokenType == 7)) || (this->m_tokenType == 6)) {
      this_00 = this->m_currentNode;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      aiString::Set(&this_00->mName,pcVar2);
    }
    else if (this->m_tokenType == 0xf) {
      aiString::aiString((aiString *)local_4b0);
      aiString::Set((aiString *)local_4b0,(string *)(aiName.data + 0x3fc));
      aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_4b0,"?mat.name",0,0);
      sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->m_materialCache)
      ;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->m_material2refMap,(key_type *)(aiName.data + 0x3fc));
      *pmVar4 = sVar3 - 1;
    }
    std::__cxx11::string::~string((string *)(aiName.data + 0x3fc));
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNameNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No current node for name." );
        return;
    }

    Value *val( node->getValue() );
    if( nullptr != val ) {
        if( Value::ddl_string != val->m_type ) {
            throw DeadlyImportError( "OpenGEX: invalid data type for value in node name." );
            return;
        }

        const std::string name( val->getString() );
        if( m_tokenType == Grammar::GeometryNodeToken || m_tokenType == Grammar::LightNodeToken
                || m_tokenType == Grammar::CameraNodeToken ) {
            m_currentNode->mName.Set( name.c_str() );
        } else if( m_tokenType == Grammar::MaterialToken ) {
            aiString aiName;
            aiName.Set( name );
            m_currentMaterial->AddProperty( &aiName, AI_MATKEY_NAME );
            m_material2refMap[ name ] = m_materialCache.size() - 1;
        }
    }
}